

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_PLYReader_::read_binary
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,bool param_3,Options *_opt)

{
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  mapped_type *pmVar3;
  mapped_type_conflict *pmVar4;
  mostream *pmVar5;
  uint uVar6;
  uint propertyIndex;
  BaseHandle BVar7;
  ulong uVar8;
  undefined1 auStack_d8 [8];
  VHandles vhandles;
  BaseHandle local_b4;
  BaseHandle local_b0;
  uint k;
  uint l;
  uint idx;
  uint nV;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  BaseHandle local_74;
  int iStack_70;
  uint j;
  Vec4i c;
  float local_48;
  uint local_44;
  float tmp;
  VertexHandle local_34;
  
  c.super_VectorDataT<int,_4>.values_._8_8_ = _opt;
  _tmp = _in;
  bVar1 = can_u_read(this,_in);
  if (bVar1) {
    auStack_d8 = (undefined1  [8])0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*_bi->_vptr_BaseImporter[0x1b])
              (_bi,(ulong)this->vertexCount_,(ulong)(this->vertexCount_ * 3),(ulong)this->faceCount_
              );
    this_00 = &this->vertexPropertyMap_;
    uVar6 = 0;
    while ((uVar6 < this->vertexCount_ &&
           (((byte)_tmp[*(long *)(*(long *)_tmp + -0x18) + 0x20] & 2) == 0))) {
      _idx = 0;
      v.super_VectorDataT<float,_3>.values_[0] = 0.0;
      v.super_VectorDataT<float,_3>.values_[1] = 0.0;
      v.super_VectorDataT<float,_3>.values_[2] = 0.0;
      n.super_VectorDataT<float,_3>.values_[0] = 0.0;
      n.super_VectorDataT<float,_3>.values_[1] = 0.0;
      n.super_VectorDataT<float,_3>.values_[2] = 0.0;
      iStack_70 = 0;
      j = 0;
      c.super_VectorDataT<int,_4>.values_[0] = 0;
      c.super_VectorDataT<int,_4>.values_[1] = 0xff;
      for (BVar7.idx_ = 0; (uint)BVar7.idx_ < this->vertexPropertyCount_;
          BVar7.idx_ = BVar7.idx_ + 1) {
        local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
        pmVar3 = std::
                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                 ::operator[](this_00,(key_type *)&local_34);
        switch(pmVar3->property) {
        case XCOORD:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,(float *)&idx);
          break;
        case YCOORD:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,(float *)&nV);
          break;
        case ZCOORD:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,(float *)&v);
          break;
        case TEXX:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,n.super_VectorDataT<float,_3>.values_ + 1);
          break;
        case TEXY:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,n.super_VectorDataT<float,_3>.values_ + 2);
          break;
        case COLORRED:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          if ((pmVar3->value == ValueTypeFLOAT32) ||
             (local_44 = BVar7.idx_,
             pmVar3 = std::
                      map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                      ::operator[](this_00,(key_type *)&local_44), pmVar3->value == ValueTypeFLOAT))
          {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readValue(this,pmVar3->value,_tmp,&local_48);
            iStack_70 = (int)(local_48 * 255.0);
          }
          else {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readInteger(this,pmVar3->value,_tmp,&iStack_70);
          }
          break;
        case COLORGREEN:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          if ((pmVar3->value == ValueTypeFLOAT32) ||
             (local_44 = BVar7.idx_,
             pmVar3 = std::
                      map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                      ::operator[](this_00,(key_type *)&local_44), pmVar3->value == ValueTypeFLOAT))
          {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readValue(this,pmVar3->value,_tmp,&local_48);
            j = (uint)(local_48 * 255.0);
          }
          else {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readInteger(this,pmVar3->value,_tmp,(int *)&j);
          }
          break;
        case COLORBLUE:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          if ((pmVar3->value == ValueTypeFLOAT32) ||
             (local_44 = BVar7.idx_,
             pmVar3 = std::
                      map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                      ::operator[](this_00,(key_type *)&local_44), pmVar3->value == ValueTypeFLOAT))
          {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readValue(this,pmVar3->value,_tmp,&local_48);
            c.super_VectorDataT<int,_4>.values_[0] = (int)(local_48 * 255.0);
          }
          else {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readInteger(this,pmVar3->value,_tmp,(int *)&c);
          }
          break;
        case COLORALPHA:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          if ((pmVar3->value == ValueTypeFLOAT32) ||
             (local_44 = BVar7.idx_,
             pmVar3 = std::
                      map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                      ::operator[](this_00,(key_type *)&local_44), pmVar3->value == ValueTypeFLOAT))
          {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readValue(this,pmVar3->value,_tmp,&local_48);
            c.super_VectorDataT<int,_4>.values_[1] = (int)(local_48 * 255.0);
          }
          else {
            local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
            pmVar3 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](this_00,(key_type *)&local_34);
            readInteger(this,pmVar3->value,_tmp,c.super_VectorDataT<int,_4>.values_ + 1);
          }
          break;
        case XNORM:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,v.super_VectorDataT<float,_3>.values_ + 1);
          break;
        case YNORM:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,v.super_VectorDataT<float,_3>.values_ + 2);
          break;
        case ZNORM:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          readValue(this,pmVar3->value,_tmp,(float *)&n);
          break;
        default:
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar7.idx_;
          pmVar3 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_34);
          pmVar4 = std::
                   map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
                   ::operator[](&this->scalar_size_,&pmVar3->value);
          consume_input(this,_tmp,*pmVar4);
        }
      }
      uVar2 = (*_bi->_vptr_BaseImporter[2])(_bi,&idx);
      uVar8 = (ulong)uVar2;
      uVar2 = *(uint *)c.super_VectorDataT<int,_4>.values_._8_8_;
      if ((uVar2 & 0x10) != 0) {
        (*_bi->_vptr_BaseImporter[8])(_bi,uVar8,v.super_VectorDataT<float,_3>.values_ + 1);
        uVar2 = *(uint *)c.super_VectorDataT<int,_4>.values_._8_8_;
      }
      if ((uVar2 & 0x40) != 0) {
        (*_bi->_vptr_BaseImporter[0xd])(_bi,uVar8,n.super_VectorDataT<float,_3>.values_ + 1);
        uVar2 = *(uint *)c.super_VectorDataT<int,_4>.values_._8_8_;
      }
      if ((uVar2 & 0x20) != 0) {
        local_34.super_BaseHandle.idx_._1_1_ = (undefined1)j;
        local_34.super_BaseHandle.idx_._0_1_ = (char)iStack_70;
        local_34.super_BaseHandle.idx_._2_1_ = (undefined1)c.super_VectorDataT<int,_4>.values_[0];
        local_34.super_BaseHandle.idx_._3_1_ = (undefined1)c.super_VectorDataT<int,_4>.values_[1];
        (*_bi->_vptr_BaseImporter[10])(_bi,uVar8,&local_34);
      }
      uVar6 = uVar6 + 1;
    }
    for (uVar6 = 0; uVar6 < this->faceCount_; uVar6 = uVar6 + 1) {
      readValue(this,this->faceIndexType_,_tmp,&l);
      c.super_VectorDataT<int,_4>.values_[2] = l;
      if (l == 3) {
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   auStack_d8,3);
        readInteger(this,this->faceEntryType_,_tmp,(uint *)&local_74);
        readInteger(this,this->faceEntryType_,_tmp,(uint *)&local_b4);
        readInteger(this,this->faceEntryType_,_tmp,(uint *)&local_b0);
        ((BaseHandle *)auStack_d8)->idx_ = local_74.idx_;
        (((pointer)((long)auStack_d8 + 4))->super_BaseHandle).idx_ = local_b4.idx_;
        (((pointer)((long)auStack_d8 + 8))->super_BaseHandle).idx_ = local_b0.idx_;
      }
      else {
        uVar2 = l;
        if ((undefined1  [8])
            vhandles.
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
            _M_impl.super__Vector_impl_data._M_start != auStack_d8) {
          vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_d8;
        }
        while (uVar2 != 0) {
          readInteger(this,this->faceEntryType_,_tmp,&k);
          local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)k;
          std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
          emplace_back<OpenMesh::VertexHandle>
                    ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     auStack_d8,&local_34);
          uVar2 = uVar2 - 1;
        }
        local_74.idx_ = c.super_VectorDataT<int,_4>.values_[2];
      }
      (*_bi->_vptr_BaseImporter[4])
                (_bi,(vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     auStack_d8);
    }
    std::_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
    ~_Vector_base((_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                  auStack_d8);
  }
  else {
    pmVar5 = omerr();
    std::operator<<(&pmVar5->super_ostream,"[PLYReader] : Unable to parse header\n");
  }
  return bVar1;
}

Assistant:

bool _PLYReader_::read_binary(std::istream& _in, BaseImporter& _bi, bool /*_swap*/, const Options& _opt) const {

    // Reparse the header
    if (!can_u_read(_in)) {
        omerr() << "[PLYReader] : Unable to parse header\n";
        return false;
    }

    unsigned int i, j, k, l, idx;
    unsigned int nV;
    OpenMesh::Vec3f        v, n;  // Vertex
    OpenMesh::Vec2f        t;  // TexCoords
    BaseImporter::VHandles vhandles;
    VertexHandle           vh;
    OpenMesh::Vec4i        c;  // Color
    float                  tmp;

    _bi.reserve(vertexCount_, 3* vertexCount_ , faceCount_);

    // read vertices:
    for (i = 0; i < vertexCount_ && !_in.eof(); ++i) {
        v[0] = 0.0;
        v[1] = 0.0;
        v[2] = 0.0;

        n[0] = 0.0;
        n[1] = 0.0;
        n[2] = 0.0;

        t[0] = 0.0;
        t[1] = 0.0;

        c[0] = 0;
        c[1] = 0;
        c[2] = 0;
        c[3] = 255;

        for (uint propertyIndex = 0; propertyIndex < vertexPropertyCount_; ++propertyIndex) {
            switch (vertexPropertyMap_[propertyIndex].property) {
            case XCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[0]);
                break;
            case YCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[1]);
                break;
            case ZCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[2]);
                break;
            case XNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[0]);
                break;
            case YNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[1]);
                break;
            case ZNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[2]);
                break;
            case TEXX:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, t[0]);
                break;
            case TEXY:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, t[1]);
                break;
            case COLORRED:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);

                    c[0] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[0]);

                break;
            case COLORGREEN:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[1] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[1]);

                break;
            case COLORBLUE:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[2] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[2]);

                break;
            case COLORALPHA:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[3] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[3]);

                break;
            default:
                // Read unsupported property
                consume_input(_in, scalar_size_[vertexPropertyMap_[propertyIndex].value]);
                break;
            }

        }

        vh = _bi.add_vertex(v);
        if (_opt.vertex_has_normal())
          _bi.set_normal(vh, n);
        if (_opt.vertex_has_texcoord())
          _bi.set_texcoord(vh, t);
        if (_opt.vertex_has_color())
          _bi.set_color(vh, Vec4uc(c));
    }

    for (i = 0; i < faceCount_; ++i) {
        // Read number of vertices for the current face
        readValue(faceIndexType_, _in, nV);

        if (nV == 3) {
            vhandles.resize(3);
            readInteger(faceEntryType_, _in, j);
            readInteger(faceEntryType_, _in, k);
            readInteger(faceEntryType_, _in, l);

            vhandles[0] = VertexHandle(j);
            vhandles[1] = VertexHandle(k);
            vhandles[2] = VertexHandle(l);
        } else {
            vhandles.clear();
            for (j = 0; j < nV; ++j) {
                readInteger(faceEntryType_, _in, idx);
                vhandles.push_back(VertexHandle(idx));
            }
        }

        _bi.add_face(vhandles);
    }

    return true;
}